

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O0

DetectorResult * ZXing::QRCode::SampleQR(BitMatrix *image,FinderPatternSet *fp)

{
  value_t value;
  value_t value_00;
  value_t value_01;
  PointT<double> PVar1;
  value_t val;
  PointF brOffset_00;
  PointF brOffset_01;
  PointF brOffset_02;
  PointT<double> b;
  PointT<double> b_00;
  QuadrilateralF pix;
  QuadrilateralF pix_00;
  QuadrilateralF pix_01;
  PointT<double> a;
  PointT<double> a_00;
  ConcentricPattern a_01;
  ConcentricPattern a_02;
  ConcentricPattern b_01;
  ConcentricPattern b_02;
  PointF estimate;
  PointF estimate_00;
  PointF estimate_01;
  PointF d;
  PointF d_00;
  PointF d_01;
  PointF p;
  PointF p_00;
  PointF p_01;
  PointF p_02;
  PointT<double> tr;
  PointT<double> tl;
  PointT<double> br_00;
  PointT<double> PVar2;
  PointT<double> PVar3;
  bool bVar4;
  int width;
  int iVar5;
  int iVar6;
  PointT<double> *pPVar7;
  Version *image_00;
  reference pvVar8;
  value_t *pvVar9;
  const_reference pvVar10;
  PointT<double> *pPVar11;
  PointT<double> *in_RDX;
  undefined8 in_RSI;
  DetectorResult *in_RDI;
  PointT<double> PVar12;
  PointF PVar13;
  int y1;
  int y0;
  int x1;
  int x0;
  int x_3;
  int y_3;
  ROIs rois;
  int x_2;
  int y_2;
  value_t c;
  optional<ZXing::PointT<double>_> found_1;
  PointF guessed_1;
  int yi;
  int i_1;
  int xi;
  int i;
  vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> verti;
  vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> hori;
  int x_1;
  int y_1;
  optional<ZXing::PointT<double>_> found;
  PointF guessed;
  int x;
  int y;
  anon_class_16_2_ef234508 bestGuessAPP;
  anon_class_24_3_a3104783 findInnerCornerOfConcentricPattern;
  anon_class_16_2_7ab91238 projectM2P;
  int N;
  Matrix<std::optional<ZXing::PointT<double>_>_> apP;
  vector<int,_std::allocator<int>_> *apM;
  Version *version;
  PerspectiveTransform mod2Pix;
  optional<ZXing::PointT<double>_> brCP;
  PointT<double> brInter;
  RegressionLine tr3;
  RegressionLine tr2;
  RegressionLine bl3;
  RegressionLine bl2;
  PointF brOffset;
  PointF br;
  int moduleSize;
  int dimension;
  DimensionEstimate best;
  DimensionEstimate left;
  DimensionEstimate top;
  value_type *__x;
  DetectorResult *pDVar14;
  Matrix<std::optional<ZXing::PointT<double>_>_> *this;
  RegressionLine *pRVar15;
  RegressionLine *l1;
  Version *l1_00;
  int iVar16;
  int x_00;
  BitMatrix *this_00;
  anon_class_16_2_ef234508 *this_01;
  undefined4 in_stack_fffffffffffff398;
  int y_00;
  undefined4 in_stack_fffffffffffff39c;
  int x_01;
  double in_stack_fffffffffffff3a0;
  anon_class_16_2_7ab91238 *this_02;
  FinderPatternSet *in_stack_fffffffffffff3b0;
  value_t *in_stack_fffffffffffff3b8;
  Matrix<std::optional<ZXing::PointT<double>_>_> *in_stack_fffffffffffff3c0;
  undefined4 in_stack_fffffffffffff3d0;
  int in_stack_fffffffffffff3d4;
  double in_stack_fffffffffffff3d8;
  RegressionLine *in_stack_fffffffffffff3e0;
  undefined8 in_stack_fffffffffffff3e8;
  undefined4 in_stack_fffffffffffff3f0;
  undefined4 in_stack_fffffffffffff3f4;
  double in_stack_fffffffffffff3f8;
  RegressionLine *in_stack_fffffffffffff400;
  int in_stack_fffffffffffff408;
  int in_stack_fffffffffffff40c;
  PerspectiveTransform *in_stack_fffffffffffff410;
  undefined4 in_stack_fffffffffffff418;
  int in_stack_fffffffffffff41c;
  BitMatrix *in_stack_fffffffffffff420;
  PerspectiveTransform *in_stack_fffffffffffff428;
  int in_stack_fffffffffffff430;
  int in_stack_fffffffffffff434;
  BitMatrix *in_stack_fffffffffffff438;
  BitMatrix *in_stack_fffffffffffff460;
  undefined4 in_stack_fffffffffffff470;
  undefined4 in_stack_fffffffffffff474;
  undefined8 in_stack_fffffffffffff478;
  undefined4 in_stack_fffffffffffff480;
  undefined4 in_stack_fffffffffffff484;
  undefined8 in_stack_fffffffffffff488;
  ConcentricPattern *in_stack_fffffffffffff490;
  int in_stack_fffffffffffff498;
  int in_stack_fffffffffffff49c;
  PerspectiveTransform *in_stack_fffffffffffff4a0;
  int in_stack_fffffffffffff508;
  int in_stack_fffffffffffff50c;
  int in_stack_fffffffffffff55c;
  BitMatrix *in_stack_fffffffffffff560;
  double in_stack_fffffffffffff568;
  double in_stack_fffffffffffff570;
  undefined8 in_stack_fffffffffffff580;
  BitMatrix *in_stack_fffffffffffff588;
  double in_stack_fffffffffffff590;
  double in_stack_fffffffffffff598;
  undefined8 in_stack_fffffffffffff5a0;
  undefined4 in_stack_fffffffffffff5a8;
  undefined1 in_stack_fffffffffffff5ac;
  undefined1 in_stack_fffffffffffff5ad;
  undefined1 in_stack_fffffffffffff5ae;
  undefined1 in_stack_fffffffffffff5af;
  int *local_a50;
  int *local_a48;
  int *local_a40;
  Quadrilateral<ZXing::PointT<double>_> local_9e0 [2];
  int local_960;
  int local_95c;
  int local_958;
  int local_954;
  int local_908;
  int local_904;
  value_type local_900;
  value_type local_8fc;
  int local_8f8;
  int local_8f4;
  double local_8d8;
  double local_8d0;
  value_type *local_8c8;
  Matrix<std::optional<ZXing::PointT<double>_>_> *pMStack_8c0;
  int local_8b0;
  int local_8ac;
  double local_8a8;
  double dStack_8a0;
  double local_898;
  double dStack_890;
  double local_888;
  double dStack_880;
  double local_878;
  double dStack_870;
  Quadrilateral<ZXing::PointT<double>_> local_860;
  PointT<double> local_820;
  undefined1 local_810 [72];
  double local_7c8;
  double local_7c0;
  undefined8 local_7b8;
  value_type *local_7b0;
  Matrix<std::optional<ZXing::PointT<double>_>_> *pMStack_7a8;
  RegressionLine *local_7a0;
  pointer local_798;
  PerspectiveTransform *pPStack_790;
  double local_768;
  double dStack_760;
  double local_758;
  double dStack_750;
  double local_708;
  double dStack_700;
  double local_6f8;
  double dStack_6f0;
  undefined1 local_6a8 [56];
  PerspectiveTransform local_670;
  PerspectiveTransform *local_610;
  double local_608;
  double local_600;
  double local_5f8;
  double local_5f0;
  double local_5e8;
  double local_5e0;
  double local_5d8;
  ConcentricPattern *local_5d0;
  double dStack_5c8;
  int local_5c0;
  int local_5bc;
  undefined1 *local_5b8;
  undefined1 **local_5b0;
  undefined8 local_5a8;
  undefined1 *local_5a0;
  undefined1 **local_598;
  undefined1 *local_590;
  vector<int,_std::allocator<int>_> *local_588;
  int local_57c;
  value_type *local_578;
  Matrix<std::optional<ZXing::PointT<double>_>_> *pMStack_570;
  RegressionLine *local_568;
  undefined1 local_560 [32];
  vector<int,_std::allocator<int>_> *local_540;
  double local_538;
  double dStack_530;
  double local_528;
  double dStack_520;
  double local_518;
  double dStack_510;
  double local_508;
  double dStack_500;
  Quadrilateral<ZXing::PointT<double>_> local_4f8;
  double local_4b8;
  double dStack_4b0;
  undefined1 local_4a8 [76];
  undefined4 local_45c;
  Version *local_458;
  PointI local_450;
  double local_448;
  double dStack_440;
  double local_438;
  double dStack_430;
  double local_428;
  double dStack_420;
  double local_418;
  double dStack_410;
  Quadrilateral<ZXing::PointT<double>_> local_408;
  double local_3c8;
  double dStack_3c0;
  undefined1 local_3b0 [72];
  double local_368;
  double dStack_360;
  PointT<double> local_358;
  double local_348;
  double local_340;
  double local_338;
  double dStack_330;
  double local_328;
  double local_320;
  double local_318;
  double local_310;
  double local_308;
  double dStack_300;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_228;
  double dStack_220;
  double local_218;
  double dStack_210;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  PointT<double> local_f8;
  PointT<double> local_e8;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  double dStack_c0;
  undefined8 local_b8;
  RegressionLine *local_a8;
  double local_a0;
  BitMatrix *local_98;
  PointT<double> *local_90;
  DetectorResult *local_88;
  RegressionLine *local_80;
  int local_78 [4];
  int local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  int local_30 [4];
  int local_20;
  PointT<double> *local_18;
  undefined8 local_10;
  
  iVar16 = (int)((ulong)in_stack_fffffffffffff580 >> 0x20);
  local_48 = in_RDX[1].y;
  local_40 = in_RDX[2].x;
  local_38 = in_RDX[2].y;
  local_60 = in_RDX[3].x;
  local_58 = in_RDX[3].y;
  local_50 = in_RDX[4].x;
  a_01.super_PointF.x._4_4_ = in_stack_fffffffffffff474;
  a_01.super_PointF.x._0_4_ = in_stack_fffffffffffff470;
  a_01.super_PointF.y = (double)in_stack_fffffffffffff478;
  a_01.size = in_stack_fffffffffffff480;
  a_01._20_4_ = in_stack_fffffffffffff484;
  b_01.super_PointF.y = (double)in_stack_fffffffffffff490;
  b_01.super_PointF.x = (double)in_stack_fffffffffffff488;
  b_01.size = in_stack_fffffffffffff498;
  b_01._20_4_ = in_stack_fffffffffffff49c;
  local_18 = in_RDX;
  local_10 = in_RSI;
  EstimateDimension(in_stack_fffffffffffff460,a_01,b_01);
  pPVar11 = (PointT<double> *)local_18[1].y;
  pDVar14 = (DetectorResult *)local_18[2].x;
  pRVar15 = (RegressionLine *)local_18[2].y;
  l1 = (RegressionLine *)local_18->x;
  local_a0 = local_18->y;
  this_00 = (BitMatrix *)local_18[1].x;
  iVar5 = (int)((ulong)local_a0 >> 0x20);
  a_02.super_PointF.x._4_4_ = in_stack_fffffffffffff474;
  a_02.super_PointF.x._0_4_ = in_stack_fffffffffffff470;
  a_02.super_PointF.y = (double)in_stack_fffffffffffff478;
  a_02.size = in_stack_fffffffffffff480;
  a_02._20_4_ = in_stack_fffffffffffff484;
  b_02.super_PointF.y = (double)in_stack_fffffffffffff490;
  b_02.super_PointF.x = (double)in_stack_fffffffffffff488;
  b_02.size = in_stack_fffffffffffff498;
  b_02._20_4_ = in_stack_fffffffffffff49c;
  local_a8 = l1;
  local_98 = this_00;
  local_90 = pPVar11;
  local_88 = pDVar14;
  local_80 = pRVar15;
  EstimateDimension(in_stack_fffffffffffff460,a_02,b_02);
  if ((local_30[0] == 0) && (local_78[0] == 0)) {
    memset(in_RDI,0,0x40);
    DetectorResult::DetectorResult(pDVar14);
    return in_RDI;
  }
  if (local_20 == local_68) {
    if (local_78[0] < local_30[0]) {
      local_a40 = local_30;
    }
    else {
      local_a40 = local_78;
    }
    local_a48 = local_a40;
  }
  else {
    if (local_20 < local_68) {
      local_a50 = local_30;
    }
    else {
      local_a50 = local_78;
    }
    local_a48 = local_a50;
  }
  local_b8 = *(undefined8 *)(local_a48 + 4);
  local_c8 = *(undefined8 *)local_a48;
  dStack_c0 = *(double *)(local_a48 + 2);
  local_cc = (int)local_c8;
  local_d0 = (int)(dStack_c0 + 1.0);
  PointT<double>::PointT(&local_e8,-1.0,-1.0);
  PointT<double>::PointT(&local_f8,3.0,3.0);
  local_148 = local_18->x;
  dStack_140 = local_18->y;
  local_158 = local_18[1].y;
  dStack_150 = local_18[2].x;
  p.y._0_4_ = in_stack_fffffffffffff5a8;
  p.x = (double)in_stack_fffffffffffff5a0;
  p.y._4_1_ = in_stack_fffffffffffff5ac;
  p.y._5_1_ = in_stack_fffffffffffff5ad;
  p.y._6_1_ = in_stack_fffffffffffff5ae;
  p.y._7_1_ = in_stack_fffffffffffff5af;
  PVar13.y = in_stack_fffffffffffff598;
  PVar13.x = in_stack_fffffffffffff590;
  TraceLine(in_stack_fffffffffffff588,p,PVar13,iVar16);
  local_1a8 = local_18->x;
  dStack_1a0 = local_18->y;
  local_1b8 = local_18[1].y;
  dStack_1b0 = local_18[2].x;
  p_00.y._0_4_ = in_stack_fffffffffffff5a8;
  p_00.x = (double)in_stack_fffffffffffff5a0;
  p_00.y._4_1_ = in_stack_fffffffffffff5ac;
  p_00.y._5_1_ = in_stack_fffffffffffff5ad;
  p_00.y._6_1_ = in_stack_fffffffffffff5ae;
  p_00.y._7_1_ = in_stack_fffffffffffff5af;
  d.y = in_stack_fffffffffffff598;
  d.x = in_stack_fffffffffffff590;
  TraceLine(in_stack_fffffffffffff588,p_00,d,iVar16);
  local_218 = local_18[3].x;
  dStack_210 = local_18[3].y;
  local_228 = local_18[1].y;
  dStack_220 = local_18[2].x;
  p_01.y._0_4_ = in_stack_fffffffffffff5a8;
  p_01.x = (double)in_stack_fffffffffffff5a0;
  p_01.y._4_1_ = in_stack_fffffffffffff5ac;
  p_01.y._5_1_ = in_stack_fffffffffffff5ad;
  p_01.y._6_1_ = in_stack_fffffffffffff5ae;
  p_01.y._7_1_ = in_stack_fffffffffffff5af;
  d_00.y = in_stack_fffffffffffff598;
  d_00.x = in_stack_fffffffffffff590;
  TraceLine(in_stack_fffffffffffff588,p_01,d_00,iVar16);
  local_278 = local_18[3].x;
  dStack_270 = local_18[3].y;
  local_288 = local_18[1].y;
  dStack_280 = local_18[2].x;
  p_02.y._0_4_ = in_stack_fffffffffffff5a8;
  p_02.x = (double)in_stack_fffffffffffff5a0;
  p_02.y._4_1_ = in_stack_fffffffffffff5ac;
  p_02.y._5_1_ = in_stack_fffffffffffff5ad;
  p_02.y._6_1_ = in_stack_fffffffffffff5ae;
  p_02.y._7_1_ = in_stack_fffffffffffff5af;
  d_01.y = in_stack_fffffffffffff598;
  d_01.x = in_stack_fffffffffffff590;
  TraceLine(in_stack_fffffffffffff588,p_02,d_01,iVar16);
  bVar4 = RegressionLine::isValid((RegressionLine *)0x2ed79b);
  if ((((bVar4) && (bVar4 = RegressionLine::isValid((RegressionLine *)0x2ed7c1), bVar4)) &&
      (bVar4 = RegressionLine::isValid((RegressionLine *)0x2ed7e7), bVar4)) &&
     (bVar4 = RegressionLine::isValid((RegressionLine *)0x2ed80d), bVar4)) {
    PVar13 = intersect(l1,pRVar15);
    local_2b0 = PVar13.y;
    local_2b8 = PVar13.x;
    PVar13 = intersect(l1,pRVar15);
    local_2c0 = PVar13.y;
    local_2c8 = PVar13.x;
    PVar12 = operator+<double,_double>((PointT<double> *)pDVar14,pPVar11);
    local_2a0 = PVar12.y;
    local_2a8 = PVar12.x;
    PVar12 = operator/((PointT<double> *)pDVar14,(int)((ulong)pPVar11 >> 0x20));
    in_stack_fffffffffffff568 = PVar12.y;
    in_stack_fffffffffffff570 = PVar12.x;
    local_2d8 = in_stack_fffffffffffff570;
    dStack_2d0 = in_stack_fffffffffffff568;
    local_298 = in_stack_fffffffffffff570;
    dStack_290 = in_stack_fffffffffffff568;
    log<double>(PVar12,3);
    if (0x15 < local_cc) {
      local_308 = local_298;
      dStack_300 = dStack_290;
      estimate.y = in_stack_fffffffffffff570;
      estimate.x = in_stack_fffffffffffff568;
      LocateAlignmentPattern(in_stack_fffffffffffff560,in_stack_fffffffffffff55c,estimate);
      bVar4 = std::optional::operator_cast_to_bool((optional<ZXing::PointT<double>_> *)0x2ed9e0);
      if (bVar4) {
        pPVar7 = std::optional<ZXing::PointT<double>_>::operator*
                           ((optional<ZXing::PointT<double>_> *)0x2ed9f6);
        local_e8.x = pPVar7->x;
        local_e8.y = pPVar7->y;
      }
    }
    local_318 = local_e8.x;
    local_310 = local_e8.y;
    PVar12.x._4_4_ = in_stack_fffffffffffff39c;
    PVar12.x._0_4_ = in_stack_fffffffffffff398;
    PVar12.y = in_stack_fffffffffffff3a0;
    bVar4 = BitMatrix::isIn<double>(this_00,PVar12,iVar5);
    if (!bVar4) {
      in_stack_fffffffffffff560 = (BitMatrix *)EstimateTilt(in_stack_fffffffffffff3b0);
      if (1.1 < (double)in_stack_fffffffffffff560) {
LAB_002edb80:
        local_e8.x = local_298;
        local_e8.y = dStack_290;
      }
      else {
        bVar4 = RegressionLine::isHighRes(in_stack_fffffffffffff400);
        in_stack_fffffffffffff55c = CONCAT13(bVar4,(int3)in_stack_fffffffffffff55c);
        if (bVar4) {
          bVar4 = RegressionLine::isHighRes(in_stack_fffffffffffff400);
          in_stack_fffffffffffff55c =
               CONCAT13((char)((uint)in_stack_fffffffffffff55c >> 0x18),
                        CONCAT12(bVar4,(short)in_stack_fffffffffffff55c));
          if (bVar4) {
            bVar4 = RegressionLine::isHighRes(in_stack_fffffffffffff400);
            in_stack_fffffffffffff55c =
                 CONCAT22((short)((uint)in_stack_fffffffffffff55c >> 0x10),
                          CONCAT11(bVar4,(char)in_stack_fffffffffffff55c));
            if (bVar4) {
              bVar4 = RegressionLine::isHighRes(in_stack_fffffffffffff400);
              in_stack_fffffffffffff55c =
                   CONCAT31((int3)((uint)in_stack_fffffffffffff55c >> 8),bVar4);
              if (bVar4) goto LAB_002edb80;
            }
          }
        }
      }
    }
  }
  local_328 = local_e8.x;
  local_320 = local_e8.y;
  PVar1.x._4_4_ = in_stack_fffffffffffff39c;
  PVar1.x._0_4_ = in_stack_fffffffffffff398;
  PVar1.y = in_stack_fffffffffffff3a0;
  bVar4 = BitMatrix::isIn<double>(this_00,PVar1,iVar5);
  if (!bVar4) {
    PVar12 = operator-<double,_double>((PointT<double> *)pDVar14,pPVar11);
    local_340 = PVar12.y;
    local_348 = PVar12.x;
    PVar12 = operator+<double,_double>((PointT<double> *)pDVar14,pPVar11);
    dStack_330 = PVar12.y;
    local_338 = PVar12.x;
    local_e8.x = local_338;
    local_e8.y = dStack_330;
    PointT<double>::PointT(&local_358,0.0,0.0);
    local_f8.x = local_358.x;
    local_f8.y = local_358.y;
  }
  local_368 = local_e8.x;
  dStack_360 = local_e8.y;
  PVar3.y = local_e8.y;
  PVar3.x = local_e8.x;
  log<double>(PVar3,3);
  local_3c8 = local_f8.x;
  dStack_3c0 = local_f8.y;
  local_418 = local_18[1].y;
  dStack_410 = local_18[2].x;
  local_428 = local_18[3].x;
  dStack_420 = local_18[3].y;
  local_438 = local_e8.x;
  dStack_430 = local_e8.y;
  local_448 = local_18->x;
  dStack_440 = local_18->y;
  PVar2.y = local_e8.y;
  PVar2.x = local_e8.x;
  Quadrilateral<ZXing::PointT<double>_>::Quadrilateral
            (&local_408,*(PointT<double> *)&local_18[1].y,local_18[3],PVar2,*local_18);
  y_00 = SUB84(local_408.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x,0);
  x_01 = (int)((ulong)local_408.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x >> 0x20);
  iVar16 = SUB84(local_408.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x,0);
  x_00 = (int)((ulong)local_408.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x >> 0x20);
  brOffset_00.y = (double)in_stack_fffffffffffff3e0;
  brOffset_00.x = in_stack_fffffffffffff3d8;
  pix.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._4_4_ = in_stack_fffffffffffff3f4;
  pix.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_ = in_stack_fffffffffffff3f0;
  pix.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y = in_stack_fffffffffffff3f8;
  pix.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x = (double)in_stack_fffffffffffff400;
  pix.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y._0_4_ = in_stack_fffffffffffff408;
  pix.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y._4_4_ = in_stack_fffffffffffff40c;
  pix.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x = (double)in_stack_fffffffffffff410;
  pix.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y._0_4_ = in_stack_fffffffffffff418;
  pix.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y._4_4_ = in_stack_fffffffffffff41c;
  pix.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x = (double)in_stack_fffffffffffff420;
  pix.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y = (double)in_stack_fffffffffffff428;
  Mod2Pix(in_stack_fffffffffffff3d4,brOffset_00,pix);
  iVar5 = local_cc;
  local_450 = Version::SymbolSize((int)((ulong)local_408.super_array<ZXing::PointT<double>,_4UL>.
                                               _M_elems[1].x >> 0x20),
                                  SUB84(local_408.super_array<ZXing::PointT<double>,_4UL>._M_elems
                                        [1].x,0));
  if (iVar5 < 0x2d) {
    SampleGrid(in_stack_fffffffffffff438,in_stack_fffffffffffff434,in_stack_fffffffffffff430,
               in_stack_fffffffffffff428);
    local_45c = 1;
  }
  else {
    image_00 = ReadVersion(in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
                           in_stack_fffffffffffff410);
    pDVar14 = (DetectorResult *)local_408.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y;
    local_458 = image_00;
    if (image_00 != (Version *)0x0) {
      width = Version::dimension((Version *)
                                 local_408.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y);
      iVar5 = width - local_cc;
      if (iVar5 < 1) {
        iVar5 = -iVar5;
      }
      pDVar14 = (DetectorResult *)local_408.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y;
      if (iVar5 < 9) {
        iVar5 = Version::dimension((Version *)
                                   local_408.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y);
        pDVar14 = (DetectorResult *)local_408.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y;
        l1_00 = (Version *)local_408.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y;
        this_01 = (anon_class_16_2_ef234508 *)
                  local_408.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y;
        this_02 = (anon_class_16_2_7ab91238 *)
                  local_408.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y;
        if (iVar5 != local_cc) {
          in_stack_fffffffffffff508 =
               Version::dimension((Version *)
                                  local_408.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y);
          local_4b8 = local_f8.x;
          dStack_4b0 = local_f8.y;
          local_508 = local_18[1].y;
          dStack_500 = local_18[2].x;
          local_518 = local_18[3].x;
          dStack_510 = local_18[3].y;
          local_528 = local_e8.x;
          dStack_520 = local_e8.y;
          local_538 = local_18->x;
          dStack_530 = local_18->y;
          br_00.y = local_e8.y;
          br_00.x = local_e8.x;
          in_stack_fffffffffffff50c = in_stack_fffffffffffff508;
          local_cc = in_stack_fffffffffffff508;
          Quadrilateral<ZXing::PointT<double>_>::Quadrilateral
                    (&local_4f8,*(PointT<double> *)&local_18[1].y,local_18[3],br_00,*local_18);
          y_00 = SUB84(local_4f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x,0);
          x_01 = (int)((ulong)local_4f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x >>
                      0x20);
          iVar16 = SUB84(local_4f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x,0);
          x_00 = (int)((ulong)local_4f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x >>
                      0x20);
          brOffset_01.y = (double)in_stack_fffffffffffff3e0;
          brOffset_01.x = in_stack_fffffffffffff3d8;
          pix_00.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._4_4_ =
               in_stack_fffffffffffff3f4;
          pix_00.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_ =
               in_stack_fffffffffffff3f0;
          pix_00.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y = in_stack_fffffffffffff3f8;
          pix_00.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x =
               (double)in_stack_fffffffffffff400;
          pix_00.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y._0_4_ =
               in_stack_fffffffffffff408;
          pix_00.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y._4_4_ =
               in_stack_fffffffffffff40c;
          pix_00.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x =
               (double)in_stack_fffffffffffff410;
          pix_00.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y._0_4_ =
               in_stack_fffffffffffff418;
          pix_00.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y._4_4_ =
               in_stack_fffffffffffff41c;
          pix_00.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x =
               (double)in_stack_fffffffffffff420;
          pix_00.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y =
               (double)in_stack_fffffffffffff428;
          Mod2Pix(in_stack_fffffffffffff3d4,brOffset_01,pix_00);
          memcpy(local_3b0,local_4a8,0x48);
          pDVar14 = (DetectorResult *)
                    local_4f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y;
          l1_00 = (Version *)local_4f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y;
          this_01 = (anon_class_16_2_ef234508 *)
                    local_4f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y;
          this_02 = (anon_class_16_2_7ab91238 *)
                    local_4f8.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y;
        }
        local_540 = Version::alignmentPatternCenters(local_458);
        Size<std::vector<int,std::allocator<int>>>((vector<int,_std::allocator<int>_> *)pDVar14);
        Size<std::vector<int,std::allocator<int>>>((vector<int,_std::allocator<int>_> *)pDVar14);
        std::optional<ZXing::PointT<double>_>::optional
                  ((optional<ZXing::PointT<double>_> *)0x2ee0e0);
        val.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
        super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._4_4_ =
             in_stack_fffffffffffff3d4;
        val.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
        super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._0_4_ =
             in_stack_fffffffffffff3d0;
        val.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
        super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.y =
             in_stack_fffffffffffff3d8;
        val.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
        super__Optional_payload_base<ZXing::PointT<double>_>._16_8_ = in_stack_fffffffffffff3e0;
        Matrix<std::optional<ZXing::PointT<double>_>_>::Matrix
                  (in_stack_fffffffffffff3c0,(int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                   (int)in_stack_fffffffffffff3b8,val);
        local_57c = Size<std::vector<int,std::allocator<int>>>
                              ((vector<int,_std::allocator<int>_> *)pMStack_570);
        local_57c = local_57c + -1;
        local_590 = local_3b0;
        local_588 = local_540;
        local_5a8 = local_10;
        local_5a0 = local_560;
        local_598 = &local_590;
        SampleQR::anon_class_24_3_a3104783::operator()
                  ((anon_class_24_3_a3104783 *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff49c,
                   in_stack_fffffffffffff498,in_stack_fffffffffffff490);
        SampleQR::anon_class_24_3_a3104783::operator()
                  ((anon_class_24_3_a3104783 *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff49c,
                   in_stack_fffffffffffff498,in_stack_fffffffffffff490);
        SampleQR::anon_class_24_3_a3104783::operator()
                  ((anon_class_24_3_a3104783 *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff49c,
                   in_stack_fffffffffffff498,in_stack_fffffffffffff490);
        local_5b8 = local_560;
        local_5b0 = &local_590;
        __x = local_578;
        this = pMStack_570;
        pRVar15 = local_568;
        for (local_5bc = 0; local_5bc <= local_57c; local_5bc = local_5bc + 1) {
          for (local_5c0 = 0; local_5c0 <= local_57c; local_5c0 = local_5c0 + 1) {
            Matrix<std::optional<ZXing::PointT<double>_>_>::operator()
                      (this,(int)((ulong)__x >> 0x20),(int)__x);
            bVar4 = std::optional::operator_cast_to_bool
                              ((optional<ZXing::PointT<double>_> *)0x2ee280);
            if (!bVar4) {
              if (local_5c0 * local_5bc == 0) {
                PVar12 = SampleQR::anon_class_16_2_ef234508::operator()(this_01,x_00,iVar16);
                dStack_5c8 = PVar12.y;
                local_5d0 = (ConcentricPattern *)PVar12.x;
              }
              else {
                PVar12 = SampleQR::anon_class_16_2_ef234508::operator()(this_01,x_00,iVar16);
                local_5e8 = PVar12.y;
                local_5f0 = PVar12.x;
                PVar12 = SampleQR::anon_class_16_2_ef234508::operator()(this_01,x_00,iVar16);
                local_5f8 = PVar12.y;
                local_600 = PVar12.x;
                PVar12 = operator+<double,_double>((PointT<double> *)this,(PointT<double> *)__x);
                local_5d8 = PVar12.y;
                local_5e0 = PVar12.x;
                PVar12 = SampleQR::anon_class_16_2_ef234508::operator()(this_01,x_00,iVar16);
                local_608 = PVar12.y;
                in_stack_fffffffffffff498 = PVar12.y._0_4_;
                in_stack_fffffffffffff49c = PVar12.y._4_4_;
                in_stack_fffffffffffff4a0 = (PerspectiveTransform *)PVar12.x;
                local_610 = in_stack_fffffffffffff4a0;
                PVar12 = operator-<double,_double>((PointT<double> *)this,(PointT<double> *)__x);
                dStack_5c8 = PVar12.y;
                in_stack_fffffffffffff490 = (ConcentricPattern *)PVar12.x;
                local_5d0 = in_stack_fffffffffffff490;
              }
              local_670.a32 = (value_t)local_5d0;
              local_670.a33 = dStack_5c8;
              estimate_00.y = in_stack_fffffffffffff570;
              estimate_00.x = in_stack_fffffffffffff568;
              LocateAlignmentPattern
                        (in_stack_fffffffffffff560,in_stack_fffffffffffff55c,estimate_00);
              bVar4 = std::optional::operator_cast_to_bool
                                ((optional<ZXing::PointT<double>_> *)0x2ee4f8);
              if (bVar4) {
                std::optional<ZXing::PointT<double>_>::operator*
                          ((optional<ZXing::PointT<double>_> *)0x2ee527);
                std::optional<ZXing::PointT<double>_>::optional<ZXing::PointT<double>_&,_true>
                          ((optional<ZXing::PointT<double>_> *)this,(PointT<double> *)__x);
                value.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._8_4_ = iVar16;
                value.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.x =
                     (double)l1_00;
                value.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._12_4_ = x_00;
                value.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._16_8_ = this_01;
                __x = (value_type *)local_670.a22;
                this = (Matrix<std::optional<ZXing::PointT<double>_>_> *)local_670.a23;
                pRVar15 = (RegressionLine *)local_670.a31;
                Matrix<std::optional<ZXing::PointT<double>_>_>::set
                          ((Matrix<std::optional<ZXing::PointT<double>_>_> *)local_670.a23,
                           (int)((ulong)local_670.a22 >> 0x20),SUB84(local_670.a22,0),value);
              }
            }
          }
        }
        for (local_670.a21._4_4_ = 0; local_670.a21._4_4_ <= local_57c;
            local_670.a21._4_4_ = local_670.a21._4_4_ + 1) {
          for (local_670.a21._0_4_ = 0; local_670.a21._0_4_ <= local_57c;
              local_670.a21._0_4_ = local_670.a21._0_4_ + 1) {
            Matrix<std::optional<ZXing::PointT<double>_>_>::operator()
                      (this,(int)((ulong)__x >> 0x20),(int)__x);
            bVar4 = std::optional::operator_cast_to_bool
                              ((optional<ZXing::PointT<double>_> *)0x2ee610);
            if (!bVar4) {
              std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::vector
                        ((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *)
                         0x2ee628);
              std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::vector
                        ((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *)
                         0x2ee635);
              local_6a8._28_4_ = 2;
              while( true ) {
                bVar4 = false;
                if ((int)local_6a8._28_4_ < local_57c * 2 + 2) {
                  iVar6 = Size<std::vector<ZXing::PointT<double>,std::allocator<ZXing::PointT<double>>>>
                                    ((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                      *)this);
                  bVar4 = iVar6 < 2;
                }
                if (!bVar4) break;
                iVar6 = -1;
                if ((int)local_6a8._28_4_ % 2 != 0) {
                  iVar6 = 1;
                }
                local_6a8._24_4_ = local_670.a21._0_4_ + ((int)local_6a8._28_4_ / 2) * iVar6;
                if ((-1 < (int)local_6a8._24_4_) && ((int)local_6a8._24_4_ <= local_57c)) {
                  Matrix<std::optional<ZXing::PointT<double>_>_>::operator()
                            (this,(int)((ulong)__x >> 0x20),(int)__x);
                  bVar4 = std::optional::operator_cast_to_bool
                                    ((optional<ZXing::PointT<double>_> *)0x2ee742);
                  if (bVar4) {
                    Matrix<std::optional<ZXing::PointT<double>_>_>::operator()
                              (this,(int)((ulong)__x >> 0x20),(int)__x);
                    std::optional<ZXing::PointT<double>_>::operator*
                              ((optional<ZXing::PointT<double>_> *)0x2ee77a);
                    std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::
                    push_back((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                               *)l1_00,(value_type *)pRVar15);
                  }
                }
                local_6a8._28_4_ = local_6a8._28_4_ + 1;
              }
              local_6a8._20_4_ = 2;
              while( true ) {
                bVar4 = false;
                if ((int)local_6a8._20_4_ < local_57c * 2 + 2) {
                  iVar6 = Size<std::vector<ZXing::PointT<double>,std::allocator<ZXing::PointT<double>>>>
                                    ((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                      *)this);
                  bVar4 = iVar6 < 2;
                }
                if (!bVar4) break;
                iVar6 = -1;
                if ((int)local_6a8._20_4_ % 2 != 0) {
                  iVar6 = 1;
                }
                local_6a8._16_4_ = local_670.a21._4_4_ + ((int)local_6a8._20_4_ / 2) * iVar6;
                if ((-1 < (int)local_6a8._16_4_) && ((int)local_6a8._16_4_ <= local_57c)) {
                  Matrix<std::optional<ZXing::PointT<double>_>_>::operator()
                            (this,(int)((ulong)__x >> 0x20),(int)__x);
                  bVar4 = std::optional::operator_cast_to_bool
                                    ((optional<ZXing::PointT<double>_> *)0x2ee8c8);
                  if (bVar4) {
                    Matrix<std::optional<ZXing::PointT<double>_>_>::operator()
                              (this,(int)((ulong)__x >> 0x20),(int)__x);
                    std::optional<ZXing::PointT<double>_>::operator*
                              ((optional<ZXing::PointT<double>_> *)0x2ee900);
                    std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::
                    push_back((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                               *)l1_00,(value_type *)pRVar15);
                  }
                }
                local_6a8._20_4_ = local_6a8._20_4_ + 1;
              }
              iVar6 = Size<std::vector<ZXing::PointT<double>,std::allocator<ZXing::PointT<double>>>>
                                ((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                  *)this);
              if ((iVar6 == 2) &&
                 (iVar6 = Size<std::vector<ZXing::PointT<double>,std::allocator<ZXing::PointT<double>>>>
                                    ((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                      *)this), iVar6 == 2)) {
                in_stack_fffffffffffff428 = &local_670;
                pvVar8 = std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                         ::operator[]((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                       *)in_stack_fffffffffffff428,0);
                local_6f8 = pvVar8->x;
                dStack_6f0 = pvVar8->y;
                pvVar8 = std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                         ::operator[]((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                       *)in_stack_fffffffffffff428,1);
                local_708 = pvVar8->x;
                dStack_700 = pvVar8->y;
                a.y = (double)in_stack_fffffffffffff400;
                a.x = in_stack_fffffffffffff3f8;
                b.y._0_4_ = in_stack_fffffffffffff3f0;
                b.x = (double)in_stack_fffffffffffff3e8;
                b.y._4_4_ = in_stack_fffffffffffff3f4;
                RegressionLine::RegressionLine<double>(in_stack_fffffffffffff3e0,a,b);
                in_stack_fffffffffffff420 = (BitMatrix *)(local_6a8 + 0x20);
                pvVar8 = std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                         ::operator[]((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                       *)in_stack_fffffffffffff420,0);
                local_758 = pvVar8->x;
                dStack_750 = pvVar8->y;
                pvVar8 = std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                         ::operator[]((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                       *)in_stack_fffffffffffff420,1);
                local_768 = pvVar8->x;
                dStack_760 = pvVar8->y;
                a_00.y = (double)in_stack_fffffffffffff400;
                a_00.x = in_stack_fffffffffffff3f8;
                b_00.y._0_4_ = in_stack_fffffffffffff3f0;
                b_00.x = (double)in_stack_fffffffffffff3e8;
                b_00.y._4_4_ = in_stack_fffffffffffff3f4;
                RegressionLine::RegressionLine<double>(in_stack_fffffffffffff3e0,a_00,b_00);
                PVar13 = intersect((RegressionLine *)l1_00,pRVar15);
                in_stack_fffffffffffff410 = (PerspectiveTransform *)PVar13.y;
                local_6a8._0_8_ = PVar13.x;
                in_stack_fffffffffffff418 = PVar13.x._0_4_;
                in_stack_fffffffffffff41c = PVar13.x._4_4_;
                local_6a8._8_8_ = in_stack_fffffffffffff410;
                RegressionLine::~RegressionLine((RegressionLine *)0x2eeaba);
                RegressionLine::~RegressionLine((RegressionLine *)0x2eeac7);
                local_798 = (pointer)local_6a8._0_8_;
                pPStack_790 = (PerspectiveTransform *)local_6a8._8_8_;
                estimate_01.y = in_stack_fffffffffffff570;
                estimate_01.x = in_stack_fffffffffffff568;
                LocateAlignmentPattern
                          (in_stack_fffffffffffff560,in_stack_fffffffffffff55c,estimate_01);
                std::optional::operator_cast_to_bool((optional<ZXing::PointT<double>_> *)0x2eeb14);
                in_stack_fffffffffffff408 = local_670.a21._0_4_;
                in_stack_fffffffffffff40c = local_670.a21._4_4_;
                bVar4 = std::optional::operator_cast_to_bool
                                  ((optional<ZXing::PointT<double>_> *)0x2eeb8c);
                if (bVar4) {
                  in_stack_fffffffffffff400 =
                       (RegressionLine *)
                       std::optional<ZXing::PointT<double>_>::operator*
                                 ((optional<ZXing::PointT<double>_> *)0x2eeb9f);
                }
                else {
                  in_stack_fffffffffffff400 = (RegressionLine *)local_6a8;
                }
                std::optional<ZXing::PointT<double>_>::optional<ZXing::PointT<double>_&,_true>
                          ((optional<ZXing::PointT<double>_> *)this,(PointT<double> *)__x);
                value_00.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._8_4_ = iVar16;
                value_00.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.x =
                     (double)l1_00;
                value_00.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._12_4_ = x_00;
                value_00.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
                super__Optional_payload_base<ZXing::PointT<double>_>._16_8_ = this_01;
                __x = local_7b0;
                this = pMStack_7a8;
                pRVar15 = local_7a0;
                Matrix<std::optional<ZXing::PointT<double>_>_>::set
                          (pMStack_7a8,(int)((ulong)local_7b0 >> 0x20),(int)local_7b0,value_00);
              }
              std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::~vector
                        ((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *)
                         l1_00);
              std::vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>::~vector
                        ((vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> *)
                         l1_00);
            }
          }
        }
        pvVar9 = Matrix<std::optional<ZXing::PointT<double>_>_>::get
                           (this,(int)((ulong)__x >> 0x20),(int)__x);
        local_7c8 = (pvVar9->super__Optional_base<ZXing::PointT<double>,_true,_true>)._M_payload.
                    super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.x;
        local_7c0 = (pvVar9->super__Optional_base<ZXing::PointT<double>,_true,_true>)._M_payload.
                    super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.y;
        local_7b8 = *(undefined8 *)
                     &(pvVar9->super__Optional_base<ZXing::PointT<double>,_true,_true>)._M_payload.
                      super__Optional_payload_base<ZXing::PointT<double>_>._M_engaged;
        bVar4 = std::optional::operator_cast_to_bool((optional<ZXing::PointT<double>_> *)0x2eecc8);
        if (bVar4) {
          iVar6 = local_cc;
          PointT<double>::PointT(&local_820,3.0,3.0);
          local_878 = local_18[1].y;
          dStack_870 = local_18[2].x;
          local_888 = local_18[3].x;
          dStack_880 = local_18[3].y;
          pPVar11 = std::optional<ZXing::PointT<double>_>::operator*
                              ((optional<ZXing::PointT<double>_> *)0x2eed2e);
          local_898 = pPVar11->x;
          dStack_890 = pPVar11->y;
          local_8a8 = local_18->x;
          dStack_8a0 = local_18->y;
          tl.y = dStack_870;
          tl.x = local_878;
          tr.y = dStack_880;
          tr.x = local_888;
          Quadrilateral<ZXing::PointT<double>_>::Quadrilateral(&local_860,tl,tr,*pPVar11,*local_18);
          y_00 = SUB84(local_860.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x,0);
          x_01 = (int)((ulong)local_860.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x >>
                      0x20);
          iVar16 = SUB84(local_860.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x,0);
          x_00 = (int)((ulong)local_860.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x >>
                      0x20);
          brOffset_02.y = (double)in_stack_fffffffffffff3e0;
          brOffset_02.x = in_stack_fffffffffffff3d8;
          pix_01.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._4_4_ = iVar6;
          pix_01.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x._0_4_ =
               in_stack_fffffffffffff3f0;
          pix_01.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y = (double)pvVar9;
          pix_01.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x =
               (double)in_stack_fffffffffffff400;
          pix_01.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y._0_4_ =
               in_stack_fffffffffffff408;
          pix_01.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y._4_4_ =
               in_stack_fffffffffffff40c;
          pix_01.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x =
               (double)in_stack_fffffffffffff410;
          pix_01.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y._0_4_ =
               in_stack_fffffffffffff418;
          pix_01.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y._4_4_ =
               in_stack_fffffffffffff41c;
          pix_01.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x =
               (double)in_stack_fffffffffffff420;
          pix_01.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y =
               (double)in_stack_fffffffffffff428;
          Mod2Pix(in_stack_fffffffffffff3d4,brOffset_02,pix_01);
          memcpy(local_3b0,local_810,0x48);
          __x = (value_type *)local_860.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x;
          this = (Matrix<std::optional<ZXing::PointT<double>_>_> *)
                 local_860.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y;
          l1_00 = (Version *)local_860.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y;
          this_01 = (anon_class_16_2_ef234508 *)
                    local_860.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y;
          this_02 = (anon_class_16_2_7ab91238 *)
                    local_860.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y;
        }
        for (local_8ac = 0; local_8ac <= local_57c; local_8ac = local_8ac + 1) {
          for (local_8b0 = 0; local_8b0 <= local_57c; local_8b0 = local_8b0 + 1) {
            Matrix<std::optional<ZXing::PointT<double>_>_>::operator()
                      (this,(int)((ulong)__x >> 0x20),(int)__x);
            bVar4 = std::optional::operator_cast_to_bool
                              ((optional<ZXing::PointT<double>_> *)0x2eee87);
            if (!bVar4) {
              PVar13 = SampleQR::anon_class_16_2_7ab91238::operator()(this_02,x_01,y_00);
              local_8d0 = PVar13.y;
              local_8d8 = PVar13.x;
              std::optional<ZXing::PointT<double>_>::optional<ZXing::PointT<double>,_true>
                        ((optional<ZXing::PointT<double>_> *)this,(PointT<double> *)__x);
              value_01.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
              super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._8_4_ = iVar16;
              value_01.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
              super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.x =
                   (double)l1_00;
              value_01.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
              super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._12_4_ = x_00;
              value_01.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
              super__Optional_payload_base<ZXing::PointT<double>_>._16_8_ = this_01;
              __x = local_8c8;
              this = pMStack_8c0;
              Matrix<std::optional<ZXing::PointT<double>_>_>::set
                        (pMStack_8c0,(int)((ulong)local_8c8 >> 0x20),(int)local_8c8,value_01);
            }
          }
        }
        std::vector<ZXing::ROI,_std::allocator<ZXing::ROI>_>::vector
                  ((vector<ZXing::ROI,_std::allocator<ZXing::ROI>_> *)0x2eef64);
        for (local_8f4 = 0; local_8f4 < local_57c; local_8f4 = local_8f4 + 1) {
          for (local_8f8 = 0; local_8f8 < local_57c; local_8f8 = local_8f8 + 1) {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](local_540,(long)local_8f8);
            local_8fc = *pvVar10;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                (local_540,(long)(local_8f8 + 1));
            local_900 = *pvVar10;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](local_540,(long)local_8f4);
            local_904 = *pvVar10;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                (local_540,(long)(local_8f4 + 1));
            local_908 = *pvVar10;
            local_960 = local_8fc + (uint)(local_8f8 == 0) * -6;
            bVar4 = local_8f8 == local_57c + -1;
            local_95c = local_900 + ((uint)bVar4 * 8 - (uint)bVar4);
            local_958 = local_904 + (uint)(local_8f4 == 0) * -6;
            bVar4 = local_8f4 == local_57c + -1;
            local_954 = local_908 + ((uint)bVar4 * 8 - (uint)bVar4);
            Rectangle<ZXing::PointT<double>>
                      ((int)((ulong)in_stack_fffffffffffff3c0 >> 0x20),
                       (int)in_stack_fffffffffffff3c0,
                       (int)((ulong)in_stack_fffffffffffff3b8 >> 0x20),
                       (int)in_stack_fffffffffffff3b8,(value_t_conflict)in_stack_fffffffffffff3b0);
            in_stack_fffffffffffff3c0 =
                 (Matrix<std::optional<ZXing::PointT<double>_>_> *)
                 Matrix<std::optional<ZXing::PointT<double>_>_>::operator()
                           (this,(int)((ulong)__x >> 0x20),(int)__x);
            pPVar11 = std::optional<ZXing::PointT<double>_>::operator*
                                ((optional<ZXing::PointT<double>_> *)0x2ef139);
            PVar12 = *pPVar11;
            in_stack_fffffffffffff3b8 =
                 Matrix<std::optional<ZXing::PointT<double>_>_>::operator()
                           (this,(int)((ulong)__x >> 0x20),(int)__x);
            pPVar11 = std::optional<ZXing::PointT<double>_>::operator*
                                ((optional<ZXing::PointT<double>_> *)0x2ef172);
            PVar1 = *pPVar11;
            in_stack_fffffffffffff3b0 =
                 (FinderPatternSet *)
                 Matrix<std::optional<ZXing::PointT<double>_>_>::operator()
                           (this,(int)((ulong)__x >> 0x20),(int)__x);
            pPVar11 = std::optional<ZXing::PointT<double>_>::operator*
                                ((optional<ZXing::PointT<double>_> *)0x2ef1ad);
            PVar2 = *pPVar11;
            Matrix<std::optional<ZXing::PointT<double>_>_>::operator()
                      (this,(int)((ulong)__x >> 0x20),(int)__x);
            pPVar11 = std::optional<ZXing::PointT<double>_>::operator*
                                ((optional<ZXing::PointT<double>_> *)0x2ef1e6);
            Quadrilateral<ZXing::PointT<double>_>::Quadrilateral
                      (local_9e0,PVar12,PVar1,PVar2,*pPVar11);
            PerspectiveTransform::PerspectiveTransform
                      (in_stack_fffffffffffff4a0,
                       (QuadrilateralF *)
                       CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498),
                       (QuadrilateralF *)in_stack_fffffffffffff490);
            std::vector<ZXing::ROI,_std::allocator<ZXing::ROI>_>::push_back
                      ((vector<ZXing::ROI,_std::allocator<ZXing::ROI>_> *)this,__x);
          }
        }
        SampleGrid((BitMatrix *)image_00,width,iVar5,
                   (ROIs *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
        local_45c = 1;
        std::vector<ZXing::ROI,_std::allocator<ZXing::ROI>_>::~vector
                  ((vector<ZXing::ROI,_std::allocator<ZXing::ROI>_> *)l1_00);
        Matrix<std::optional<ZXing::PointT<double>_>_>::~Matrix
                  ((Matrix<std::optional<ZXing::PointT<double>_>_> *)0x2ef31b);
        goto LAB_002ef35f;
      }
    }
    memset(in_RDI,0,0x40);
    DetectorResult::DetectorResult(pDVar14);
    local_45c = 1;
  }
LAB_002ef35f:
  RegressionLine::~RegressionLine((RegressionLine *)0x2ef36c);
  RegressionLine::~RegressionLine((RegressionLine *)0x2ef379);
  RegressionLine::~RegressionLine((RegressionLine *)0x2ef386);
  RegressionLine::~RegressionLine((RegressionLine *)0x2ef393);
  return in_RDI;
}

Assistant:

DetectorResult SampleQR(const BitMatrix& image, const FinderPatternSet& fp)
{
	auto top  = EstimateDimension(image, fp.tl, fp.tr);
	auto left = EstimateDimension(image, fp.tl, fp.bl);

	if (!top.dim && !left.dim)
		return {};

	auto best = top.err == left.err ? (top.dim > left.dim ? top : left) : (top.err < left.err ? top : left);
	int dimension = best.dim;
	int moduleSize = static_cast<int>(best.ms + 1);

	auto br = PointF{-1, -1};
	auto brOffset = PointF{3, 3};

	// Everything except version 1 (21 modules) has an alignment pattern. Estimate the center of that by intersecting
	// line extensions of the 1 module wide square around the finder patterns. This could also help with detecting
	// slanted symbols of version 1.

	// generate 4 lines: outer and inner edge of the 1 module wide black line between the two outer and the inner
	// (tl) finder pattern
	auto bl2 = TraceLine(image, fp.bl, fp.tl, 2);
	auto bl3 = TraceLine(image, fp.bl, fp.tl, 3);
	auto tr2 = TraceLine(image, fp.tr, fp.tl, 2);
	auto tr3 = TraceLine(image, fp.tr, fp.tl, 3);

	if (bl2.isValid() && tr2.isValid() && bl3.isValid() && tr3.isValid()) {
		// intersect both outer and inner line pairs and take the center point between the two intersection points
		auto brInter = (intersect(bl2, tr2) + intersect(bl3, tr3)) / 2;
		log(brInter, 3);

		if (dimension > 21)
			if (auto brCP = LocateAlignmentPattern(image, moduleSize, brInter))
				br = *brCP;

		// if the symbol is tilted or the resolution of the RegressionLines is sufficient, use their intersection
		// as the best estimate (see discussion in #199 and test image estimate-tilt.jpg )
		if (!image.isIn(br) && (EstimateTilt(fp) > 1.1 || (bl2.isHighRes() && bl3.isHighRes() && tr2.isHighRes() && tr3.isHighRes())))
			br = brInter;
	}

	// otherwise the simple estimation used by upstream is used as a best guess fallback
	if (!image.isIn(br)) {
		br = fp.tr - fp.tl + fp.bl;
		brOffset = PointF(0, 0);
	}

	log(br, 3);
	auto mod2Pix = Mod2Pix(dimension, brOffset, {fp.tl, fp.tr, br, fp.bl});

	if( dimension >= Version::SymbolSize(7, Type::Model2).x) {
		auto version = ReadVersion(image, dimension, mod2Pix);

		// if the version bits are garbage -> discard the detection
		if (!version || std::abs(version->dimension() - dimension) > 8)
			return DetectorResult();
		if (version->dimension() != dimension) {
			printf("update dimension: %d -> %d\n", dimension, version->dimension());
			dimension = version->dimension();
			mod2Pix = Mod2Pix(dimension, brOffset, {fp.tl, fp.tr, br, fp.bl});
		}
#if 1
		auto& apM = version->alignmentPatternCenters(); // alignment pattern positions in modules
		auto apP = Matrix<std::optional<PointF>>(Size(apM), Size(apM)); // found/guessed alignment pattern positions in pixels
		const int N = Size(apM) - 1;

		// project the alignment pattern at module coordinates x/y to pixel coordinate based on current mod2Pix
		auto projectM2P = [&mod2Pix, &apM](int x, int y) { return mod2Pix(centered(PointI(apM[x], apM[y]))); };

		auto findInnerCornerOfConcentricPattern = [&image, &apP, &projectM2P](int x, int y, const ConcentricPattern& fp) {
			auto pc = *apP.set(x, y, projectM2P(x, y));
			if (auto fpQuad = FindConcentricPatternCorners(image, fp, fp.size, 2))
				for (auto c : *fpQuad)
					if (distance(c, pc) < fp.size / 2)
						apP.set(x, y, c);
		};

		findInnerCornerOfConcentricPattern(0, 0, fp.tl);
		findInnerCornerOfConcentricPattern(0, N, fp.bl);
		findInnerCornerOfConcentricPattern(N, 0, fp.tr);

		auto bestGuessAPP = [&](int x, int y){
			if (auto p = apP(x, y))
				return *p;
			return projectM2P(x, y);
		};

		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x) {
				if (apP(x, y))
					continue;

				PointF guessed =
					x * y == 0 ? bestGuessAPP(x, y) : bestGuessAPP(x - 1, y) + bestGuessAPP(x, y - 1) - bestGuessAPP(x - 1, y - 1);
				if (auto found = LocateAlignmentPattern(image, moduleSize, guessed))
					apP.set(x, y, *found);
			}

		// go over the whole set of alignment patters again and try to fill any remaining gap by using available neighbors as guides
		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x) {
				if (apP(x, y))
					continue;

				// find the two closest valid alignment pattern pixel positions both horizontally and vertically
				std::vector<PointF> hori, verti;
				for (int i = 2; i < 2 * N + 2 && Size(hori) < 2; ++i) {
					int xi = x + i / 2 * (i%2 ? 1 : -1);
					if (0 <= xi && xi <= N && apP(xi, y))
						hori.push_back(*apP(xi, y));
				}
				for (int i = 2; i < 2 * N + 2 && Size(verti) < 2; ++i) {
					int yi = y + i / 2 * (i%2 ? 1 : -1);
					if (0 <= yi && yi <= N && apP(x, yi))
						verti.push_back(*apP(x, yi));
				}

				// if we found 2 each, intersect the two lines that are formed by connecting the point pairs
				if (Size(hori) == 2 && Size(verti) == 2) {
					auto guessed = intersect(RegressionLine(hori[0], hori[1]), RegressionLine(verti[0], verti[1]));
					auto found = LocateAlignmentPattern(image, moduleSize, guessed);
					// search again near that intersection and if the search fails, use the intersection
					if (!found) printf("location guessed at %dx%d\n", x, y);
					apP.set(x, y, found ? *found : guessed);
				}
			}

		if (auto c = apP.get(N, N))
			mod2Pix = Mod2Pix(dimension, PointF(3, 3), {fp.tl, fp.tr, *c, fp.bl});

		// go over the whole set of alignment patters again and fill any remaining gaps by a projection based on an updated mod2Pix
		// projection. This works if the symbol is flat, wich is a reasonable fall-back assumption.
		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x) {
				if (apP(x, y))
					continue;

				printf("locate failed at %dx%d\n", x, y);
				apP.set(x, y, projectM2P(x, y));
			}

#ifdef PRINT_DEBUG
		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x)
				log(*apP(x, y), 2);
#endif

		// assemble a list of region-of-interests based on the found alignment pattern pixel positions
		ROIs rois;
		for (int y = 0; y < N; ++y)
			for (int x = 0; x < N; ++x) {
				int x0 = apM[x], x1 = apM[x + 1], y0 = apM[y], y1 = apM[y + 1];
				rois.push_back({x0 - (x == 0) * 6, x1 + (x == N - 1) * 7, y0 - (y == 0) * 6, y1 + (y == N - 1) * 7,
								PerspectiveTransform{Rectangle(x0, x1, y0, y1),
													 {*apP(x, y), *apP(x + 1, y), *apP(x + 1, y + 1), *apP(x, y + 1)}}});
			}

		return SampleGrid(image, dimension, dimension, rois);
#endif
	}

	return SampleGrid(image, dimension, dimension, mod2Pix);
}